

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O2

string * __thiscall
POSGDiscrete::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,POSGDiscrete *this)

{
  string *psVar1;
  ulong uVar2;
  ostream *poVar3;
  const_reference ppRVar4;
  E *this_00;
  uint uVar5;
  string local_1e0;
  string *local_1c0;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_
            (&local_1e0,&this->super_MultiAgentDecisionProcessDiscrete);
  std::operator<<(local_1a8,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  POSG::SoftPrint_abi_cxx11_
            (&local_1e0,(POSG *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200);
  std::operator<<(local_1a8,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (this->_m_initialized == true) {
    uVar5 = 0;
    while( true ) {
      uVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      psVar1 = local_1c0;
      if (uVar2 <= uVar5) break;
      poVar3 = std::operator<<(local_1a8,"Reward model for agent ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": ");
      std::endl<char,std::char_traits<char>>(poVar3);
      ppRVar4 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                          (&this->_m_p_rModel,(ulong)uVar5);
      (*((*ppRVar4)->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
        _vptr_QTableInterface[5])(&local_1e0);
      poVar3 = std::operator<<(local_1a8,(string *)&local_1e0);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_1e0);
      uVar5 = uVar5 + 1;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return psVar1;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"POSGDiscrete components (reward model) not initialized");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string POSGDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscrete::SoftPrint();
    ss << POSG::SoftPrint();

    if(_m_initialized)
    {
        for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        {
            ss << "Reward model for agent "<<agentI<<": " << endl;
            ss << _m_p_rModel.at(agentI)->SoftPrint() << endl;
        }
    }
    else
        throw E("POSGDiscrete components (reward model) not initialized");

    return(ss.str());
}